

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_address.cpp
# Opt level: O3

ElementsNetType
cfd::js::api::ElementsAddressStructApi::ConvertElementsNetType(string *elements_net_type)

{
  int iVar1;
  CfdException *this;
  ElementsNetType EVar2;
  undefined1 local_40 [32];
  
  iVar1 = std::__cxx11::string::compare((char *)elements_net_type);
  if (iVar1 == 0) {
    EVar2 = kLiquidV1;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)elements_net_type);
    EVar2 = kElementsRegtest;
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)elements_net_type);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)elements_net_type);
        if (iVar1 != 0) {
          local_40._0_8_ = "cfdjs_elements_address.cpp";
          local_40._8_4_ = 0x160;
          local_40._16_8_ = "ConvertElementsNetType";
          core::logger::log<std::__cxx11::string_const&>
                    ((CfdSourceLocation *)local_40,kCfdLogLevelWarning,
                     "Failed to ConvertElementsNetType. Invalid elements_network_type passed:  elements_network_type={}"
                     ,elements_net_type);
          this = (CfdException *)__cxa_allocate_exception(0x30);
          local_40._0_8_ = local_40 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_40,
                     "Invalid elements_network_type passed. elements_network_type must be \"liquidv1\" or \"liquidregtest\" or \"elementsregtest\" or \"regtest\"."
                     ,"");
          core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_40);
          __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
    }
  }
  return EVar2;
}

Assistant:

ElementsNetType ElementsAddressStructApi::ConvertElementsNetType(
    const std::string& elements_net_type) {
  ElementsNetType net_type;
  if (elements_net_type == "liquidv1") {
    net_type = ElementsNetType::kLiquidV1;
  } else if (
      (elements_net_type == "regtest") ||
      (elements_net_type == "liquidregtest") ||
      (elements_net_type == "elementsregtest")) {
    net_type = ElementsNetType::kElementsRegtest;
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to ConvertElementsNetType. Invalid elements_network_type "
        "passed:  elements_network_type={}",  // NOLINT
        elements_net_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid elements_network_type passed. elements_network_type must be "
        "\"liquidv1\" or \"liquidregtest\" or \"elementsregtest\" "
        "or \"regtest\".");  // NOLINT
  }
  return net_type;
}